

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

int Amap_LibFindNode(Amap_Lib_t *pLib,int iFan0,int iFan1,int fXor)

{
  int iVar1;
  Vec_Int_t *p;
  
  p = (Vec_Int_t *)Vec_PtrEntry((&pLib->vRules)[fXor != 0],iFan0);
  iVar1 = Vec_IntCheckWithMask(p,iFan1);
  return iVar1;
}

Assistant:

int Amap_LibFindNode( Amap_Lib_t * pLib, int iFan0, int iFan1, int fXor )
{
    if ( fXor )
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRulesX, iFan0), iFan1 );
    else
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRules, iFan0), iFan1 );
}